

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O0

Path<SquareCell> *
xmotion::Dijkstra::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *graph,SquareCell sstate,
          SquareCell gstate,GetNeighbourFunc_t<SquareCell,_double> *get_neighbours)

{
  SquareCell state;
  SquareCell state_00;
  bool bVar1;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *in_RDX;
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  *in_RDI;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *in_stack_00000020;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  *in_stack_00000028;
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  *in_stack_00000030;
  vertex_iterator *wp;
  iterator __end0;
  iterator __begin0;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *__range2;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  path_vtx;
  vertex_iterator goal_vtx;
  GetNeighbourFunc_t<SquareCell,_double> *in_stack_000000e0;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *in_stack_000000e8;
  vertex_iterator in_stack_000000f0;
  vertex_iterator start_vtx;
  Path<SquareCell> *path;
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  *this;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  in_stack_ffffffffffffff40;
  
  state.idx.y = in_stack_ffffffffffffff38;
  state.idx.x = in_stack_ffffffffffffff30;
  state.id = (int64_t)in_stack_ffffffffffffff40._M_current;
  this = in_RDI;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddVertex(in_RDX,state);
  state_00.idx.y = in_stack_ffffffffffffff38;
  state_00.idx.x = in_stack_ffffffffffffff30;
  state_00.id = (int64_t)in_stack_ffffffffffffff40._M_current;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddVertex(in_RDX,state_00);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::function(this,in_stack_00000030);
  PerformSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (in_stack_000000e8,start_vtx,in_stack_000000f0,in_stack_000000e0);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::~function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
               *)0x1022be);
  std::vector<SquareCell,_std::allocator<SquareCell>_>::vector
            ((vector<SquareCell,_std::allocator<SquareCell>_> *)0x1022cd);
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::begin(in_stack_00000020);
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::end(in_stack_00000020);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_00000028,
                            (__normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
                             *)in_stack_00000020), bVar1) {
    __gnu_cxx::
    __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
    ::operator*((__normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
                 *)&stack0xffffffffffffff40);
    Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator::operator->
              ((vertex_iterator *)0x102326);
    std::vector<SquareCell,_std::allocator<SquareCell>_>::push_back
              ((vector<SquareCell,_std::allocator<SquareCell>_> *)this,
               (value_type *)in_stack_00000030);
    __gnu_cxx::
    __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
    ::operator++((__normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
                  *)&stack0xffffffffffffff40);
  }
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::~vector((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
             *)this);
  return (Path<SquareCell> *)in_RDI;
}

Assistant:

static Path<State> IncSearch(
      Graph<State, Transition, StateIndexer> *graph, State sstate, State gstate,
      GetNeighbourFunc_t<State, Transition> get_neighbours) {
    auto start_vtx = graph->AddVertex(sstate);
    auto goal_vtx = graph->AddVertex(gstate);
    auto path_vtx =
        Dijkstra::PerformSearch(graph, start_vtx, goal_vtx, get_neighbours);

    Path<State> path;
    for (auto &wp : path_vtx) path.push_back(wp->state);
    return path;
  }